

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.2.4.11.h
# Opt level: O0

String * doctest::toString<long_double>(IsNaN<long_double> in)

{
  String *in_RDI;
  unkbyte10 in_stack_00000008;
  undefined2 uVar1;
  undefined6 in_stack_ffffffffffffff32;
  char *in_stack_ffffffffffffff38;
  undefined2 uVar2;
  undefined6 uStack_b6;
  String *in_stack_ffffffffffffff70;
  String *in_stack_ffffffffffffff78;
  
  uVar2 = SUB82(in_RDI,0);
  uStack_b6 = (undefined6)((ulong)in_RDI >> 0x10);
  String::String(in_RDI,in_stack_ffffffffffffff38);
  String::String(in_RDI,in_stack_ffffffffffffff38);
  operator+(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  uVar1 = (undefined2)((unkuint10)in_stack_00000008 >> 0x40);
  toString((longdouble)CONCAT28(uVar2,in_RDI));
  operator+(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  String::String(in_RDI,in_stack_ffffffffffffff38);
  operator+(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  String::~String((String *)CONCAT62(in_stack_ffffffffffffff32,uVar1));
  String::~String((String *)CONCAT62(in_stack_ffffffffffffff32,uVar1));
  String::~String((String *)CONCAT62(in_stack_ffffffffffffff32,uVar1));
  String::~String((String *)CONCAT62(in_stack_ffffffffffffff32,uVar1));
  String::~String((String *)CONCAT62(in_stack_ffffffffffffff32,uVar1));
  String::~String((String *)CONCAT62(in_stack_ffffffffffffff32,uVar1));
  return (String *)CONCAT62(uStack_b6,uVar2);
}

Assistant:

String toString(IsNaN<F> in) { return String(in.flipped ? "! " : "") + "IsNaN( " + doctest::toString(in.value) + " )"; }